

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int linear_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar10 = *e;
  dVar12 = *f;
  bVar8 = dVar10 < dVar12 == dVar12 <= -dVar10;
  if (bVar8) {
    dVar11 = f[1];
    dVar9 = dVar12;
  }
  else {
    dVar9 = dVar10;
    dVar10 = e[1];
    dVar11 = dVar12;
  }
  uVar7 = (ulong)!bVar8;
  uVar4 = (ulong)bVar8;
  uVar5 = (uint)!bVar8;
  if (((int)uVar5 < elen) && ((flen <= (int)(uint)bVar8 || (dVar10 < dVar11 != dVar11 <= -dVar10))))
  {
    dVar12 = dVar10 + dVar9;
    dVar13 = dVar12 - dVar10;
    uVar7 = (ulong)(uVar5 + 1);
    dVar10 = e[uVar7];
  }
  else {
    dVar12 = dVar11 + dVar9;
    dVar13 = dVar12 - dVar11;
    uVar4 = (ulong)(bVar8 + 1);
    dVar11 = f[uVar4];
  }
  dVar9 = dVar9 - dVar13;
  iVar1 = 0;
  for (iVar2 = 2; iVar2 < flen + elen; iVar2 = iVar2 + 1) {
    iVar6 = (int)uVar7;
    iVar3 = (int)uVar4;
    if ((iVar6 < elen) && ((flen <= iVar3 || (dVar10 < dVar11 != dVar11 <= -dVar10)))) {
      dVar13 = dVar9 + dVar10;
      dVar14 = dVar13 - dVar10;
      uVar7 = (ulong)(iVar6 + 1);
      dVar10 = e[(long)iVar6 + 1];
    }
    else {
      dVar13 = dVar9 + dVar11;
      dVar14 = dVar13 - dVar11;
      uVar4 = (ulong)(iVar3 + 1);
      dVar11 = f[(long)iVar3 + 1];
    }
    dVar9 = dVar9 - dVar14;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      h[iVar1] = dVar9;
      iVar1 = iVar1 + 1;
    }
    dVar14 = dVar12 + dVar13;
    dVar9 = (dVar12 - (dVar14 - (dVar14 - dVar12))) + (dVar13 - (dVar14 - dVar12));
    dVar12 = dVar14;
  }
  if ((dVar9 != 0.0) || (iVar2 = iVar1, NAN(dVar9))) {
    iVar2 = iVar1 + 1;
    h[iVar1] = dVar9;
  }
  if (((dVar12 == 0.0) && (!NAN(dVar12))) && (iVar2 != 0)) {
    return iVar2;
  }
  h[iVar2] = dVar12;
  return iVar2 + 1;
}

Assistant:

int linear_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f,
                                  REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}